

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISentenceReader.cpp
# Opt level: O0

void __thiscall ISentenceReader::getWord(ISentenceReader *this,string *str)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  int local_20;
  int num3;
  char tempChar;
  string *str_local;
  ISentenceReader *this_local;
  
  local_20 = 0;
  do {
    cVar1 = std::istream::get();
    if (cVar1 == -1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        return;
      }
      std::__cxx11::string::length();
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)str);
      if (*pcVar3 == this->m_seg) {
        return;
      }
      std::__cxx11::string::operator=((string *)str,"");
      return;
    }
    if (cVar1 == this->m_seg) {
      std::__cxx11::string::operator+=((string *)str,cVar1);
      return;
    }
    std::__cxx11::string::operator+=((string *)str,cVar1);
    if (cVar1 == '\n') {
      std::__cxx11::string::operator+=((string *)str,'\n');
    }
    else if (cVar1 == '{') {
      local_20 = local_20 + 1;
    }
    else if (cVar1 == '}') {
      local_20 = local_20 + -1;
    }
  } while (-1 < local_20);
  std::__cxx11::string::operator=((string *)str,"");
  return;
}

Assistant:

void ISentenceReader::getWord(std::string &str) {
    char tempChar;
    int num3=0;

    while((tempChar = m_ifs->get()) != EOF)
    {
        if(tempChar!=m_seg)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='{')
                num3++;
            else if(tempChar=='}')
                num3--;
            if(num3<0)
            {
                str="";
                return;
            }
        }
        else
        {
            str+=tempChar;
            return;
        }
    }
    if(!str.empty()&&str[str.length()-1]!=m_seg)
    {
        str="";
    }
}